

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O3

void __thiscall nn::ESoinn::deleteNodes(ESoinn *this)

{
  int iVar1;
  AbstractWeightVector *pAVar2;
  long lVar3;
  ConcreteLogger *this_00;
  size_type sVar4;
  pointer pEVar5;
  pointer pEVar6;
  ulong uVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  double dVar11;
  double local_68;
  double local_60;
  string local_58;
  uint local_2c;
  
  this_00 = log_netw;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"deleteNodes function","");
  logger::ConcreteLogger::debug(this_00,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_2c = 0;
  pEVar5 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar6 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar5) {
    uVar8 = 0;
    do {
      if (pEVar5[uVar8].m_IsDeleted == false) {
        if ((int)pEVar5[uVar8].m_Neighbours._M_h._M_element_count == 0) {
          pAVar2 = pEVar5[uVar8].super_AbstractNeuron.m_wv;
          if (pAVar2 != (AbstractWeightVector *)0x0) {
            (*pAVar2->_vptr_AbstractWeightVector[7])();
            uVar8 = (ulong)local_2c;
            pEVar5 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          pEVar5[uVar8].m_IsDeleted = true;
        }
        iVar1 = (int)pEVar5[uVar8].m_Neighbours._M_h._M_element_count;
        if (iVar1 == 2) {
          local_68 = pEVar5[uVar8].m_Density;
          local_60 = this->m_C2;
          dVar11 = calcAvgDensity(this);
        }
        else {
          if (iVar1 != 1) goto LAB_001313aa;
          local_68 = pEVar5[uVar8].m_Density;
          local_60 = this->m_C1;
          dVar11 = calcAvgDensity(this);
        }
        if (local_68 < local_60 * dVar11) {
          if (local_58._M_string_length == local_58.field_2._M_allocated_capacity) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,
                       (iterator)local_58._M_string_length,&local_2c);
          }
          else {
            *(uint *)local_58._M_string_length = local_2c;
            local_58._M_string_length = local_58._M_string_length + 4;
          }
        }
      }
LAB_001313aa:
      sVar4 = local_58._M_string_length;
      local_2c = local_2c + 1;
      uVar8 = (ulong)local_2c;
      pEVar5 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar6 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar7 = ((long)pEVar6 - (long)pEVar5 >> 3) * -0xf0f0f0f0f0f0f0f;
    } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
    _Var9._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_dataplus._M_p != (pointer)local_58._M_string_length) {
      do {
        deleteNeuron(this,*(uint32_t *)_Var9._M_p);
        _Var9._M_p = _Var9._M_p + 4;
      } while (_Var9._M_p != (pointer)sVar4);
      pEVar5 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar6 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  if (pEVar6 != pEVar5) {
    uVar8 = 0;
    uVar7 = 1;
    do {
      if ((pEVar5[uVar8].m_IsDeleted == false) &&
         ((int)pEVar5[uVar8].m_Neighbours._M_h._M_element_count == 0)) {
        pAVar2 = pEVar5[uVar8].super_AbstractNeuron.m_wv;
        if (pAVar2 != (AbstractWeightVector *)0x0) {
          (*pAVar2->_vptr_AbstractWeightVector[7])();
          pEVar5 = (this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pEVar6 = (this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        pEVar5[uVar8].m_IsDeleted = true;
      }
      uVar8 = ((long)pEVar6 - (long)pEVar5 >> 3) * -0xf0f0f0f0f0f0f0f;
      bVar10 = uVar7 <= uVar8;
      lVar3 = uVar8 - uVar7;
      uVar8 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar10 && lVar3 != 0);
  }
  if ((uint32_t *)local_58._M_dataplus._M_p != (uint32_t *)0x0) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ESoinn::deleteNodes()
    {
        log_netw->debug("deleteNodes function");
        //list of neurons which we will delete
        std::vector<uint32_t> deleted_neurons;
        //double avg_density = calcAvgDensity();
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
            
            if (m_Neurons[i].getNumNeighbours() == 1)
            {
                if (m_Neurons[i].density() < m_C1 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }
            else if (m_Neurons[i].getNumNeighbours() == 2)
            {
                if (m_Neurons[i].density() < m_C2 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }            
        }
        //delete neurons from list
        for (uint32_t num: deleted_neurons)
            deleteNeuron(num);    

        //delete neurons without neighbours (it may appeared after deletion other neurons)
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
        }
    }